

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

string * dynamicgraph::toString<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *v,
                   int precision,int width,string *separator)

{
  bool bVar1;
  ostream *poVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  if (precision < width) {
    if (lVar4 == 8) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 1;
      do {
        *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
        *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)width;
        *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
        poVar2 = std::ostream::_M_insert<double>(pdVar3[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(separator->_M_dataplus)._M_p,separator->_M_string_length);
        pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) - 1;
        bVar1 = uVar7 < uVar5;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar1);
    }
    *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = (long)width;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
  }
  else {
    if (lVar4 == 8) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 1;
      do {
        *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
        *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
        poVar2 = std::ostream::_M_insert<double>(pdVar3[uVar6]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(separator->_M_dataplus)._M_p,separator->_M_string_length);
        pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) - 1;
        bVar1 = uVar7 < uVar5;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar1);
    }
    *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
    *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = (long)precision;
  }
  std::ostream::_M_insert<double>(pdVar3[uVar5]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const std::vector<T> &v, const int precision = 3,
                     const int width = -1, const std::string separator = ", ") {
  std::stringstream ss;
  if (width > precision) {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setw(width) << std::setprecision(precision)
         << v[i] << separator;
    ss << std::fixed << std::setw(width) << std::setprecision(precision)
       << v[v.size() - 1];
  } else {
    for (unsigned int i = 0; i < v.size() - 1; i++)
      ss << std::fixed << std::setprecision(precision) << v[i] << separator;
    ss << std::fixed << std::setprecision(precision) << v[v.size() - 1];
  }

  return ss.str();
}